

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

void __thiscall
slang::ast::CheckerInstanceSymbol::serializeTo
          (CheckerInstanceSymbol *this,ASTSerializer *serializer)

{
  pointer ppAVar1;
  size_t sVar2;
  ASTSerializer *in_RAX;
  pointer pCVar3;
  pointer pCVar4;
  long lVar5;
  Connection *conn;
  span<const_slang::ast::CheckerInstanceSymbol::Connection,_18446744073709551615UL> sVar6;
  string_view name;
  string_view name_00;
  string_view name_01;
  anon_class_8_1_79d3bf50 local_38;
  
  local_38.serializer = in_RAX;
  ASTSerializer::write(serializer,4,"body",(size_t)this->body);
  name._M_str = "connections";
  name._M_len = 0xb;
  ASTSerializer::startArray(serializer,name);
  sVar6 = getPortConnections(this);
  pCVar3 = sVar6._M_ptr;
  pCVar4 = pCVar3 + sVar6._M_extent._M_extent_value._M_extent_value;
  for (; pCVar3 != pCVar4; pCVar3 = pCVar3 + 1) {
    ASTSerializer::startObject(serializer);
    name_00._M_str = "formal";
    name_00._M_len = 6;
    ASTSerializer::writeLink(serializer,name_00,pCVar3->formal);
    local_38.serializer = serializer;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/source/ast/symbols/InstanceSymbols.cpp:2576:13)_&&,_const_std::variant<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>_&>
      ::_S_vtable._M_arr
      [*(__index_type *)
        ((long)&(pCVar3->actual).
                super__Variant_base<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                .
                super__Move_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                .
                super__Copy_assign_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                .
                super__Move_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                .
                super__Copy_ctor_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
                .
                super__Variant_storage_alias<const_slang::ast::Expression_*,_const_slang::ast::AssertionExpr_*,_const_slang::ast::TimingControl_*>
        + 8)]._M_data)(&local_38,&pCVar3->actual);
    if ((pCVar3->attributes)._M_extent._M_extent_value != 0) {
      name_01._M_str = "attributes";
      name_01._M_len = 10;
      ASTSerializer::startArray(serializer,name_01);
      ppAVar1 = (pCVar3->attributes)._M_ptr;
      sVar2 = (pCVar3->attributes)._M_extent._M_extent_value;
      for (lVar5 = 0; sVar2 << 3 != lVar5; lVar5 = lVar5 + 8) {
        ASTSerializer::serialize(serializer,*(Symbol **)((long)ppAVar1 + lVar5),false);
      }
      ASTSerializer::endArray(serializer);
    }
    ASTSerializer::endObject(serializer);
  }
  ASTSerializer::endArray(serializer);
  return;
}

Assistant:

void CheckerInstanceSymbol::serializeTo(ASTSerializer& serializer) const {
    serializer.write("body", body);

    serializer.startArray("connections");
    for (auto& conn : getPortConnections()) {
        serializer.startObject();

        serializer.writeLink("formal", conn.formal);
        std::visit(
            [&](auto&& arg) {
                if (arg)
                    serializer.write("actual", *arg);
            },
            conn.actual);

        if (!conn.attributes.empty()) {
            serializer.startArray("attributes");
            for (auto attr : conn.attributes)
                serializer.serialize(*attr);
            serializer.endArray();
        }

        serializer.endObject();
    }
    serializer.endArray();
}